

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_spirv_c.cpp
# Opt level: O3

dxil_spv_result
dxil_spv_parsed_blob_scan_resources
          (dxil_spv_parsed_blob blob,dxil_spv_srv_remapper_cb srv_remapper,
          dxil_spv_sampler_remapper_cb sampler_remapper,dxil_spv_cbv_remapper_cb cbv_remapper,
          dxil_spv_uav_remapper_cb uav_remapper,void *userdata)

{
  ResourceRemappingInterface local_90;
  dxil_spv_srv_remapper_cb local_88;
  void *local_80;
  dxil_spv_sampler_remapper_cb local_78;
  void *local_70;
  dxil_spv_uav_remapper_cb local_68;
  void *local_60;
  dxil_spv_cbv_remapper_cb local_58;
  void *local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  undefined8 local_8;
  
  local_90._vptr_ResourceRemappingInterface =
       (_func_int **)&PTR__ResourceRemappingInterface_001f3140;
  local_48 = 0;
  uStack_40 = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_28 = 0;
  uStack_20 = 0;
  local_18 = 0;
  uStack_10 = 0;
  local_8 = 0;
  local_88 = srv_remapper;
  local_80 = userdata;
  local_78 = sampler_remapper;
  local_70 = userdata;
  local_68 = uav_remapper;
  local_60 = userdata;
  local_58 = cbv_remapper;
  local_50 = userdata;
  dxil_spv::Converter::scan_resources(&local_90,&blob->bc);
  return DXIL_SPV_SUCCESS;
}

Assistant:

dxil_spv_result dxil_spv_parsed_blob_scan_resources(dxil_spv_parsed_blob blob,
                                                    dxil_spv_srv_remapper_cb srv_remapper,
                                                    dxil_spv_sampler_remapper_cb sampler_remapper,
                                                    dxil_spv_cbv_remapper_cb cbv_remapper,
                                                    dxil_spv_uav_remapper_cb uav_remapper, void *userdata)
{
	Remapper remapper;
	remapper.srv_remapper = srv_remapper;
	remapper.srv_userdata = userdata;
	remapper.sampler_remapper = sampler_remapper;
	remapper.sampler_userdata = userdata;
	remapper.cbv_remapper = cbv_remapper;
	remapper.cbv_userdata = userdata;
	remapper.uav_remapper = uav_remapper;
	remapper.uav_userdata = userdata;

	Converter::scan_resources(&remapper, blob->bc);
	return DXIL_SPV_SUCCESS;
}